

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> __thiscall
duckdb::Binder::BindMaterializedCTE(Binder *this,CommonTableExpressionMap *cte_map)

{
  unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
  *this_00;
  pointer ppVar1;
  _Head_base<0UL,_duckdb::CTENode_*,_false> _Var2;
  QueryNode *pQVar3;
  Binder *statement;
  pointer pCVar4;
  pointer pCVar5;
  pointer pSVar6;
  pointer pQVar7;
  reference pvVar8;
  CommonTableExpressionMap *in_RDX;
  _Head_base<0UL,_duckdb::BoundCTENode_*,_false> this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var9;
  pointer __p;
  _Head_base<0UL,_duckdb::CTENode_*,_false> _Var10;
  pointer ppVar11;
  unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> cte_root;
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
  materialized_ctes;
  unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> *bound_cte;
  _Head_base<0UL,_duckdb::CTENode_*,_false> local_b8;
  _Head_base<0UL,_duckdb::CTENode_*,_false> local_b0;
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  local_a8;
  _Head_base<0UL,_duckdb::BoundCTENode_*,_false> local_90;
  Binder *local_88;
  InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
  local_80;
  
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (in_RDX->map).map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90._M_head_impl = (BoundCTENode *)this;
  local_88 = (Binder *)cte_map;
  for (ppVar11 = (in_RDX->map).map.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1; ppVar11 = ppVar11 + 1
      ) {
    this_00 = &ppVar11->second;
    pCVar4 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
             ::operator->(this_00);
    if (pCVar4->materialized == CTE_MATERIALIZE_ALWAYS) {
      make_uniq<duckdb::CTENode>();
      pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                         ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *
                          )&local_80);
      ::std::__cxx11::string::_M_assign((string *)&pCVar5->ctename);
      pCVar4 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->(&pCVar4->query);
      pQVar7 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&pSVar6->node);
      (*pQVar7->_vptr_QueryNode[5])(&local_b8,pQVar7);
      pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                         ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *
                          )&local_80);
      _Var10._M_head_impl = local_b8._M_head_impl;
      local_b8._M_head_impl = (CTENode *)0x0;
      _Var9._M_head_impl =
           (pCVar5->query).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pCVar5->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var10._M_head_impl)->super_QueryNode;
      if ((_Var9._M_head_impl != (QueryNode *)0x0) &&
         ((**(code **)((long)(_Var9._M_head_impl)->_vptr_QueryNode + 8))(),
         local_b8._M_head_impl != (CTENode *)0x0)) {
        (*((local_b8._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      pCVar4 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                         ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *
                          )&local_80);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pCVar5->aliases,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pCVar4);
      ::std::
      vector<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>,std::allocator<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>
                ((vector<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>,std::allocator<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>>
                  *)&local_a8,
                 (unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                 &local_80);
      if (local_80.map.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((local_80.map.
                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                       .
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + 8))();
      }
    }
  }
  if (local_a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ((local_90._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode = (_func_int **)0x0;
    this_01._M_head_impl = local_90._M_head_impl;
  }
  else {
    local_b8._M_head_impl = (CTENode *)0x0;
    _Var10._M_head_impl = (CTENode *)0x0;
    while (statement = local_88,
          local_a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_a8.
          super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      local_b0._M_head_impl = (CTENode *)0x0;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
               ::back((vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
                       *)&local_a8);
      _Var2._M_head_impl =
           (pvVar8->super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>)._M_t.
           super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
           super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl;
      (pvVar8->super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
      super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl = (CTENode *)0x0;
      if (local_b0._M_head_impl != (CTENode *)0x0) {
        pQVar3 = &(local_b0._M_head_impl)->super_QueryNode;
        local_b0._M_head_impl = _Var2._M_head_impl;
        (*pQVar3->_vptr_QueryNode[1])();
        _Var2._M_head_impl = local_b0._M_head_impl;
      }
      local_b0._M_head_impl = _Var2._M_head_impl;
      CommonTableExpressionMap::Copy((CommonTableExpressionMap *)&local_80,in_RDX);
      pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                         ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *
                          )&local_b0);
      InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
      ::operator=(&(pCVar5->super_QueryNode).cte_map.map,&local_80);
      InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
      ::~InsertionOrderPreservingMap(&local_80);
      if (_Var10._M_head_impl == (CTENode *)0x0) {
        pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_b0);
        _Var9._M_head_impl =
             (pCVar5->child).
             super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
             super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
        (pCVar5->child).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      }
      else {
        local_b8._M_head_impl = (CTENode *)0x0;
        pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_b0);
        _Var9._M_head_impl =
             (pCVar5->child).
             super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
             super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
        (pCVar5->child).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
             &(_Var10._M_head_impl)->super_QueryNode;
      }
      if (_Var9._M_head_impl != (QueryNode *)0x0) {
        (*(_Var9._M_head_impl)->_vptr_QueryNode[1])();
      }
      _Var10._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (CTENode *)0x0;
      local_b8._M_head_impl = _Var10._M_head_impl;
      local_a8.
      super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      ::std::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>::~unique_ptr
                (&(local_a8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>);
      if (local_b0._M_head_impl != (CTENode *)0x0) {
        (*((local_b0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
    }
    AddCTEMap(local_88,in_RDX);
    this_01._M_head_impl = local_90._M_head_impl;
    pCVar5 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                       ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                        &local_b8);
    QueryNode::Cast<duckdb::CTENode>(&pCVar5->super_QueryNode);
    BindCTE((Binder *)this_01._M_head_impl,(CTENode *)statement);
    if (local_b8._M_head_impl != (CTENode *)0x0) {
      (*((local_b8._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ::~vector(&local_a8);
  return (unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)
         (__uniq_ptr_impl<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)
         this_01._M_head_impl;
}

Assistant:

unique_ptr<BoundCTENode> Binder::BindMaterializedCTE(CommonTableExpressionMap &cte_map) {
	// Extract materialized CTEs from cte_map
	vector<unique_ptr<CTENode>> materialized_ctes;
	for (auto &cte : cte_map.map) {
		auto &cte_entry = cte.second;
		if (cte_entry->materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
			auto mat_cte = make_uniq<CTENode>();
			mat_cte->ctename = cte.first;
			mat_cte->query = cte_entry->query->node->Copy();
			mat_cte->aliases = cte_entry->aliases;
			materialized_ctes.push_back(std::move(mat_cte));
		}
	}

	if (materialized_ctes.empty()) {
		return nullptr;
	}

	unique_ptr<CTENode> cte_root = nullptr;
	while (!materialized_ctes.empty()) {
		unique_ptr<CTENode> node_result;
		node_result = std::move(materialized_ctes.back());
		node_result->cte_map = cte_map.Copy();
		if (cte_root) {
			node_result->child = std::move(cte_root);
		} else {
			node_result->child = nullptr;
		}
		cte_root = std::move(node_result);
		materialized_ctes.pop_back();
	}

	AddCTEMap(cte_map);
	auto bound_cte = BindCTE(cte_root->Cast<CTENode>());

	return bound_cte;
}